

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiPopupData *pIVar4;
  ImGuiWindow *popup_window;
  int m;
  bool popup_or_descendent_is_ref_window;
  ImGuiPopupData *popup;
  int popup_count_to_keep;
  ImGuiContext *g;
  bool restore_focus_to_window_under_popup_local;
  ImGuiWindow *ref_window_local;
  
  pIVar2 = GImGui;
  bVar3 = ImVector<ImGuiPopupData>::empty(&GImGui->OpenPopupStack);
  if (!bVar3) {
    popup._4_4_ = 0;
    if (ref_window != (ImGuiWindow *)0x0) {
      for (; popup._4_4_ < (pIVar2->OpenPopupStack).Size; popup._4_4_ = popup._4_4_ + 1) {
        pIVar4 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,popup._4_4_);
        if (pIVar4->Window != (ImGuiWindow *)0x0) {
          if ((pIVar4->Window->Flags & 0x4000000U) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                          ,0x1c9c,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((pIVar4->Window->Flags & 0x1000000U) == 0) {
            bVar3 = false;
            popup_window._0_4_ = popup._4_4_;
            while( true ) {
              bVar1 = false;
              if ((int)popup_window < (pIVar2->OpenPopupStack).Size) {
                bVar1 = (bool)(bVar3 ^ 1);
              }
              if (!bVar1) break;
              pIVar4 = ImVector<ImGuiPopupData>::operator[]
                                 (&pIVar2->OpenPopupStack,(int)popup_window);
              if ((pIVar4->Window != (ImGuiWindow *)0x0) &&
                 (pIVar4->Window->RootWindow == ref_window->RootWindow)) {
                bVar3 = true;
              }
              popup_window._0_4_ = (int)popup_window + 1;
            }
            if (!bVar3) break;
          }
        }
      }
    }
    if (popup._4_4_ < (pIVar2->OpenPopupStack).Size) {
      ClosePopupToLevel(popup._4_4_,restore_focus_to_window_under_popup);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack when popups are not direct descendant of the reference window (the reference window is often the NavWindow)
            bool popup_or_descendent_is_ref_window = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_is_ref_window; m++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[m].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                        popup_or_descendent_is_ref_window = true;
            if (!popup_or_descendent_is_ref_window)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}